

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPluginAPI.cxx
# Opt level: O2

void cmAddDefinition(void *arg,char *name,char *value)

{
  size_t sVar1;
  string_view value_00;
  allocator<char> local_39;
  string local_38;
  
  if (value != (char *)0x0) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,name,&local_39);
    sVar1 = strlen(value);
    value_00._M_str = value;
    value_00._M_len = sVar1;
    cmMakefile::AddDefinition((cmMakefile *)arg,&local_38,value_00);
    std::__cxx11::string::~string((string *)&local_38);
  }
  return;
}

Assistant:

static void CCONV cmAddDefinition(void* arg, const char* name,
                                  const char* value)
{
  if (value) {
    cmMakefile* mf = static_cast<cmMakefile*>(arg);
    mf->AddDefinition(name, value);
  }
}